

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioreg_util.h
# Opt level: O0

_Bool is_ioreg_writable(uint32_t address)

{
  bool local_19;
  uint local_18;
  uint local_14;
  ioreg_access_t access;
  uint32_t mirrored;
  uint32_t address_local;
  _Bool local_1;
  
  local_14 = address;
  if ((address & 0xff00ffff) == 0x4000800) {
    local_14 = 0x4000800;
  }
  if (local_14 < 0x4000804) {
    if ((local_14 & 0xff00ffff) == 0x4000800) {
      local_18 = 0x4000800;
    }
    else {
      local_18 = local_14;
    }
    local_19 = io_register_access[local_18 + 0xfc000000] == W ||
               io_register_access[local_18 + 0xfc000000] == RW;
    local_1 = local_19;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_ioreg_writable(word address) {
    word mirrored = mirror_ioreg(address);
    if (mirrored >= 0x4000804) {
        return false;
    }
    else {
        ioreg_access_t access = io_register_access[ioreg_index(mirrored)];
        return access == W || access == RW;
    }
}